

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
property_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  int iVar1;
  code *pcVar2;
  QDebug local_70 [8];
  char buffer [80];
  
  while (((iVar1 = std::istream::peek(), iVar1 != 10 &&
          (iVar1 = std::istream::peek(), iVar1 != 0x3d)) &&
         (iVar1 = std::istream::peek(), iVar1 != 0x5b))) {
    std::istream::ignore();
  }
  iVar1 = std::istream::peek();
  if (iVar1 != 10) {
    iVar1 = std::istream::peek();
    if (iVar1 != 0x3d) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      return __return_storage_ptr__;
    }
    std::istream::ignore();
    clear_empty(f);
    iVar1 = std::istream::peek();
    if (iVar1 == 0x7b) {
      parser();
      if ((parser()::category[0x10] & 1) != 0) {
        parser();
        buffer[0] = '\x02';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        buffer[0x18] = parser()::category[8];
        buffer[0x19] = parser()::category[9];
        buffer[0x1a] = parser()::category[10];
        buffer[0x1b] = parser()::category[0xb];
        buffer[0x1c] = parser()::category[0xc];
        buffer[0x1d] = parser()::category[0xd];
        buffer[0x1e] = parser()::category[0xe];
        buffer[0x1f] = parser()::category[0xf];
        QMessageLogger::debug();
        QDebug::operator<<(local_70,"starting the set property set");
        QDebug::~QDebug(local_70);
      }
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      pcVar2 = begin_property_set_state;
      goto LAB_0010538d;
    }
    std::istream::getline((char *)f,(long)buffer,'P');
    std::__cxx11::string::assign((char *)((anonymous_namespace)::current_property + 0x30));
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  pcVar2 = end_property_state;
LAB_0010538d:
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t property_state(MetaConfiguration &conf, std::ifstream &f,
                          int &error) {
  while (f.peek() != '\n' && f.peek() != '=' && f.peek() != '[') {
    f.ignore();
  }

  // easy, line finished, next property or class.
  if (f.peek() == '\n') {
    return end_property_state;
  } else if (f.peek() == '=') {
    f.ignore();
    clear_empty(f);
    if (f.peek() == '{') {
      qCDebug(parser) << "starting the set property set";
      return begin_property_set_state;
    } else {
      char buffer[80];
      f.getline(buffer, 80, '\n');
      current_property->default_value = buffer;
      return end_property_state;
    }
  }
  return nullptr;
}